

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseContent(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  byte *pbVar5;
  bool bVar6;
  int iParsed;
  xmlChar *cur_1;
  uint cons_1;
  xmlChar *test_1;
  xmlChar *cur;
  uint cons;
  xmlChar *test;
  int nameNr;
  xmlParserCtxtPtr ctxt_local;
  
  iVar1 = ctxt->nameNr;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->mlType == XML_TYPE_XML) {
    do {
      bVar6 = false;
      if (*ctxt->input->cur != '\0') {
        bVar6 = ctxt->instate != XML_PARSER_EOF;
      }
      if (!bVar6) {
        return;
      }
      pxVar2 = ctxt->input->cur;
      uVar3 = ctxt->input->consumed;
      pxVar4 = ctxt->input->cur;
      if ((*pxVar4 == '<') && (pxVar4[1] == '?')) {
        xmlParsePI(ctxt);
      }
      else if ((((*ctxt->input->cur == '<') &&
                ((((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '[')) &&
                  (ctxt->input->cur[3] == 'C')) &&
                 ((ctxt->input->cur[4] == 'D' && (ctxt->input->cur[5] == 'A')))))) &&
               (ctxt->input->cur[6] == 'T')) &&
              ((ctxt->input->cur[7] == 'A' && (ctxt->input->cur[8] == '[')))) {
        xmlParseCDSect(ctxt);
      }
      else if ((*pxVar4 == '<') &&
              (((ctxt->input->cur[1] == '!' && (ctxt->input->cur[2] == '-')) &&
               (ctxt->input->cur[3] == '-')))) {
        xmlParseComment(ctxt);
        ctxt->instate = XML_PARSER_CONTENT;
      }
      else if (*pxVar4 == '<') {
        if (ctxt->input->cur[1] == '/') {
          if (ctxt->nameNr <= iVar1) {
            return;
          }
          xmlParseElementEnd(ctxt);
        }
        else {
          xmlParseElementStart(ctxt);
        }
      }
      else if (*pxVar4 == '&') {
        xmlParseReference(ctxt);
      }
      else {
        xmlParseCharData(ctxt,0);
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
        xmlSHRINK(ctxt);
      }
    } while (((uVar3 & 0xffffffff) != ctxt->input->consumed) || (pxVar2 != ctxt->input->cur));
    xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
    xmlHaltParser(ctxt);
  }
  else {
    ctxt->quoted = 0;
    do {
      bVar6 = false;
      if ((*ctxt->input->cur != '\0') &&
         (((ctxt->curly != 0 ||
           ((bVar6 = false, *ctxt->input->cur != '\n' && (bVar6 = false, *ctxt->input->cur != ';')))
           ) && (bVar6 = false, *ctxt->input->cur != '}')))) {
        bVar6 = ctxt->instate != XML_PARSER_EOF;
      }
      if (!bVar6) {
        return;
      }
      pxVar2 = ctxt->input->cur;
      uVar3 = ctxt->input->consumed;
      pbVar5 = ctxt->input->cur;
      bVar6 = false;
      if (*pbVar5 == 0x22) {
        ctxt->quoted = (uint)((ctxt->quoted != 0 ^ 0xffU) & 1);
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
      }
      if (ctxt->quoted == 0) {
        if (*pbVar5 == 0x3b) {
          ctxt->input->cur = ctxt->input->cur + 1;
          ctxt->input->col = ctxt->input->col + 1;
          if (*ctxt->input->cur == '\0') {
            xmlParserInputGrow(ctxt->input,0xfa);
          }
          if (((*pbVar5 == 0x20) || (((8 < *pbVar5 && (*pbVar5 < 0xb)) || (*pbVar5 == 0xd)))) &&
             (*pbVar5 != 10)) {
            xmlParseCharData(ctxt,0);
            bVar6 = true;
          }
        }
        else if (*pbVar5 == 0x3f) {
          xmlParsePI(ctxt);
          bVar6 = true;
        }
        else if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '[')) &&
                (ctxt->input->cur[2] == '[')) {
          xmlParseCDSect(ctxt);
          bVar6 = true;
        }
        else if (*pbVar5 == 0x23) {
          xmlParseComment(ctxt);
          ctxt->instate = XML_PARSER_CONTENT;
          bVar6 = true;
        }
        else if (((*pbVar5 != 0x20) && ((*pbVar5 < 9 || (10 < *pbVar5)))) &&
                ((*pbVar5 != 0xd && ((*pbVar5 != 0x22 && (ctxt->curly == 1)))))) {
          xmlParseElement(ctxt);
          bVar6 = true;
        }
      }
      if (!bVar6) {
        if (*pbVar5 == 0x26) {
          xmlParseReference(ctxt);
        }
        else {
          xmlParseCharData(ctxt,0);
        }
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (((ctxt->progressive == 0) && (500 < (long)ctxt->input->cur - (long)ctxt->input->base)) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
        xmlSHRINK(ctxt);
      }
    } while (((uVar3 & 0xffffffff) != ctxt->input->consumed) || (pxVar2 != ctxt->input->cur));
    xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
    xmlHaltParser(ctxt);
  }
  return;
}

Assistant:

void
xmlParseContent(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    DEBUG_ENTER(("xmlParseContent(%s);\n", dbgCtxt(ctxt)));
    GROW;
    if (ISXML) {						/* XML*/
	while ((RAW != 0) &&
	       (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *test = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;
	    const xmlChar *cur = ctxt->input->cur;

	    /*
	     * First case : a Processing Instruction.
	     */
	    if ((*cur == '<') && (cur[1] == '?')) {
		xmlParsePI(ctxt);
	    }

	    /*
	     * Second case : a CDSection
	     */
	    /* 2.6.0 test was *cur not RAW */
	    else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
		xmlParseCDSect(ctxt);
	    }

	    /*
	     * Third case :  a comment
	     */
	    else if ((*cur == '<') && (NXT(1) == '!') &&
		     (NXT(2) == '-') && (NXT(3) == '-')) {
		xmlParseComment(ctxt);
		ctxt->instate = XML_PARSER_CONTENT;
	    }

	    /*
	     * Fourth case :  a sub-element.
	     */
	    else if (*cur == '<') {
		if (NXT(1) == '/') {
		    if (ctxt->nameNr <= nameNr)
			break;
		    xmlParseElementEnd(ctxt);
		} else {
		    xmlParseElementStart(ctxt);
		}
	    }

	    /*
	     * Fifth case : a reference. If if has not been resolved,
	     *    parsing returns its Name, create the node
	     */

	    else if (*cur == '&') {
		xmlParseReference(ctxt);
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		xmlParseCharData(ctxt, 0);
	    }

	    GROW;
	    SHRINK;

	    if ((cons == ctxt->input->consumed) && (test == CUR_PTR)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
			    "detected an error in element content\n");
		xmlHaltParser(ctxt);
		break;
	    }
	}
    } else {							/* SML */
    	ctxt->quoted = 0;
	while ((RAW != 0) &&
	       /* Within a {curly block}, new lines are part of the text
	          Else, they flag the end of the element */
	       /* Likewise, within a {curly block}, ; flags the end of an inner element
	          Else, they flag the end of the current element */
	       ((ctxt->curly) || ((RAW != '\n') && (RAW != ';'))) &&
	       (RAW != '}') &&
	       (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *test = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;
	    const xmlChar *cur = ctxt->input->cur;
	    XDEBUG_PRINTF(("*cur = '%s';\n", dbgChar(RAW)));
	    int iParsed = 0;

	    if (*cur == '"') {
		ctxt->quoted = !ctxt->quoted;
		SKIP(1);
	    }

	    if (!ctxt->quoted) {
		/*
		 * An element separator
		 */
		if (*cur == ';') {
		    SKIP(1);
		    if (IS_BLANK_CH(*cur) && (*cur != '\n')) {
			xmlParseCharData(ctxt, 0);
			iParsed = 1;
		    }
		}

		/*
		 * First case : a Processing Instruction.
		 */
		else if (*cur == '?') {
		    xmlParsePI(ctxt);
		    iParsed = 1;
		}

		/*
		 * Second case : a CDSection
		 */
		else if (CMP3(CUR_PTR, '<', '[', '[')) {
		    xmlParseCDSect(ctxt);
		    iParsed = 1;
		}

		/*
		 * Third case :  a comment
		 */
		else if (*cur == '#') {
		    xmlParseComment(ctxt);
		    ctxt->instate = XML_PARSER_CONTENT;
		    iParsed = 1;
		}

		/*
		 * Fourth case :  a sub-element.
		 */
		else if ((!IS_BLANK_CH(*cur)) && (*cur != '"') && (ctxt->curly == 1)) {
		    xmlParseElement(ctxt);
		    iParsed = 1;
		}
	    }

	    if (!iParsed) {
		/*
		 * Fifth case : a reference. If if has not been resolved,
		 *    parsing returns its Name, create the node
		 */

		if (*cur == '&') {
		    xmlParseReference(ctxt);
		}

		/*
		 * Last case, text. Note that References are handled directly.
		 */
		else {
		    xmlParseCharData(ctxt, 0);
		}
	    }

	    GROW;
	    SHRINK;

	    if ((cons == ctxt->input->consumed) && (test == CUR_PTR)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
			    "detected an error in element content\n");
		xmlHaltParser(ctxt);
		break;
	    }
	}
    }
    RETURN_COMMENT(("xmlParseContent. ctxt = %s;\n", dbgCtxt(ctxt)));
}